

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<1,451>::Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Type<1,451> *this,HEAD *head,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT)

{
  long *lineNumber_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int in_EAX;
  int MAT_00;
  
  lineNumber_00 = (long *)(ulong)(uint)MAT;
  MAT_00 = MAT;
  BaseWithoutMT<njoy::ENDFtk::section::Type<1,_451>_>::BaseWithoutMT
            ((BaseWithoutMT<njoy::ENDFtk::section::Type<1,_451>_> *)this,head,MAT,1);
  uVar1 = *(undefined4 *)head;
  uVar2 = *(undefined4 *)(head + 8);
  uVar3 = *(undefined4 *)(head + 0x10);
  *(undefined4 *)(this + 0x10) = *(undefined4 *)(head + 0x18);
  *(undefined4 *)(this + 0x14) = uVar3;
  *(undefined4 *)(this + 0x18) = uVar2;
  *(undefined4 *)(this + 0x1c) = uVar1;
  readParameters<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((array<njoy::ENDFtk::ControlRecord,_3UL> *)(this + 0x20),(Type<1,451> *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,lineNumber_00,MAT_00);
  readSequence<njoy::ENDFtk::TextRecord,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((vector<njoy::ENDFtk::TextRecord,_std::allocator<njoy::ENDFtk::TextRecord>_> *)
             (this + 0xb0),(ENDFtk *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,lineNumber_00,1,0x1c3,*(int *)(this + 0x88),in_EAX);
  readSequence<njoy::ENDFtk::DirectoryRecord,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((vector<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>
              *)(this + 200),(ENDFtk *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,lineNumber_00,1,0x1c3,*(int *)(this + 0x80),in_EAX);
  BaseWithoutMT<njoy::ENDFtk::section::Type<1,451>>::
  readSEND<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(begin,end,lineNumber,MAT,1);
  return;
}

Assistant:

Type ( HEAD& head,
       Iterator& begin,
       const Iterator& end,
       long& lineNumber,
       int MAT )
  try :

    BaseWithoutMT( head, MAT, 1 ), lrp_( head.L1() ), lfi_( head.L2() ),
    nlib_( head.N1() ), nmod_( head.N2() ),
    parameters_( readParameters( begin, end, lineNumber, MAT ) ),
    description_( readSequence< TextRecord >(
                      begin, end, lineNumber, MAT, 1, 451,
                      this->parameters_[2].N1() ) ),
    index_( readSequence< DirectoryRecord >(
                begin, end, lineNumber, MAT, 1, 451,
                this->parameters_[2].N2() ) ) {
    readSEND(begin, end, lineNumber, MAT, 1 );
  }
  catch( std::exception& e ) {

    Log::info( "Trouble while reading section 451 of File 1 of Material {}",
               MAT );
    Log::info( "lineNumber: {}", lineNumber );
    throw e;
  }